

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dep_for_basicchild_boostfunc.cpp
# Opt level: O0

void g(int *ptr)

{
  ostream *poVar1;
  ostream *this;
  type __d;
  rep_conflict rVar2;
  bind_t<void,_void_(*)(int_&,_int),_boost::_bi::list2<boost::arg<1>,_boost::_bi::value<int>_>_>
  bVar3;
  scoped_lock l_1;
  function<void_(int_&)> binded_h;
  scoped_lock l;
  spin_mutex_t *in_stack_ffffffffffffff18;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff20;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff28;
  function<void_(int_&)> *in_stack_ffffffffffffff30;
  function<void_(int_&)> *in_stack_ffffffffffffff60;
  duration<double,_std::ratio<1L,_1L>_> local_90 [2];
  _func_void_int_ptr_int *local_80;
  storage2<boost::arg<1>,_boost::_bi::value<int>_> local_78;
  _func_void_int_ptr_int *local_68;
  storage2<boost::arg<1>,_boost::_bi::value<int>_> local_60;
  undefined1 local_58 [32];
  undefined8 local_38;
  rep local_30;
  duration<double,_std::ratio<1L,_1L>_> local_28 [5];
  
  spin_mutex_t::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  poVar1 = std::operator<<((ostream *)&std::cerr,"g begin: ");
  local_38 = std::chrono::_V2::system_clock::now();
  local_30 = (rep)std::chrono::operator-(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff30,
             &in_stack_ffffffffffffff28->__d);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_28);
  this = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x124c95);
  bVar3 = boost::bind<void,int&,int,boost::arg<1>,int>(h,10);
  local_80 = bVar3.f_;
  local_78.a2_.t_ =
       (value<int>)bVar3.l_.super_storage2<boost::arg<1>,_boost::_bi::value<int>_>.a2_.t_;
  bVar3._8_8_ = this;
  bVar3.f_ = (_func_void_int_ptr_int *)local_58;
  local_68 = local_80;
  local_60.a2_.t_ = local_78.a2_.t_;
  boost::function<void(int&)>::
  function<boost::_bi::bind_t<void,void(*)(int&,int),boost::_bi::list2<boost::arg<1>,boost::_bi::value<int>>>>
            (in_stack_ffffffffffffff30,bVar3,(type)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  depspawn::spawn<boost::function<void(int&)>,int&>(in_stack_ffffffffffffff60,(int *)poVar1);
  spin_mutex_t::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  poVar1 = std::operator<<((ostream *)&std::cerr,"g finish: ");
  std::chrono::_V2::system_clock::now();
  __d = std::chrono::operator-(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1L>_> *)poVar1,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)__d.__r);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_90);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x124dae);
  boost::function<void_(int_&)>::~function((function<void_(int_&)> *)0x124dbd);
  return;
}

Assistant:

void g(int *ptr) {
  LOG("g begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count());
  
  boost::function<void(int&)> binded_h = boost::bind(h, _1, 10);
  
  //binded_h(*ptr); //Test to see that the function works
  
  spawn(binded_h, (*ptr));
  
  LOG("g finish: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count());
}